

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

OPJ_BOOL opj_j2k_write_all_coc
                   (opj_j2k_t *p_j2k,opj_stream_private *p_stream,opj_event_mgr *p_manager)

{
  OPJ_BOOL OVar1;
  uint local_2c;
  OPJ_UINT32 compno;
  opj_event_mgr *p_manager_local;
  opj_stream_private *p_stream_local;
  opj_j2k_t *p_j2k_local;
  
  if (p_j2k == (opj_j2k_t *)0x0) {
    __assert_fail("p_j2k != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                  ,0x14dd,
                  "OPJ_BOOL opj_j2k_write_all_coc(opj_j2k_t *, struct opj_stream_private *, struct opj_event_mgr *)"
                 );
  }
  if (p_manager != (opj_event_mgr *)0x0) {
    if (p_stream == (opj_stream_private *)0x0) {
      __assert_fail("p_stream != 00",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                    ,0x14df,
                    "OPJ_BOOL opj_j2k_write_all_coc(opj_j2k_t *, struct opj_stream_private *, struct opj_event_mgr *)"
                   );
    }
    local_2c = 1;
    while( true ) {
      if (p_j2k->m_private_image->numcomps <= local_2c) {
        return 1;
      }
      OVar1 = opj_j2k_compare_coc(p_j2k,0,local_2c);
      if ((OVar1 == 0) && (OVar1 = opj_j2k_write_coc(p_j2k,local_2c,p_stream,p_manager), OVar1 == 0)
         ) break;
      local_2c = local_2c + 1;
    }
    return 0;
  }
  __assert_fail("p_manager != 00",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                ,0x14de,
                "OPJ_BOOL opj_j2k_write_all_coc(opj_j2k_t *, struct opj_stream_private *, struct opj_event_mgr *)"
               );
}

Assistant:

static OPJ_BOOL opj_j2k_write_all_coc(
    opj_j2k_t *p_j2k,
    struct opj_stream_private *p_stream,
    struct opj_event_mgr * p_manager)
{
    OPJ_UINT32 compno;

    /* preconditions */
    assert(p_j2k != 00);
    assert(p_manager != 00);
    assert(p_stream != 00);

    for (compno = 1; compno < p_j2k->m_private_image->numcomps; ++compno) {
        /* cod is first component of first tile */
        if (! opj_j2k_compare_coc(p_j2k, 0, compno)) {
            if (! opj_j2k_write_coc(p_j2k, compno, p_stream, p_manager)) {
                return OPJ_FALSE;
            }
        }
    }

    return OPJ_TRUE;
}